

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivpatch1base_eval.cpp
# Opt level: O1

Vec3<embree::vfloat_impl<4>_> *
embree::sse2::patchEval<embree::vfloat_impl<4>>
          (SubdivPatch1Base *patch,vfloat_impl<4> *uu,vfloat_impl<4> *vv)

{
  uchar uVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Vec3<embree::vfloat_impl<4>_> *in_RDI;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar57 [16];
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar105 [16];
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  uint uVar126;
  uint uVar127;
  uint uVar128;
  uint uVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  
  uVar1 = patch->type;
  if (uVar1 == '\x02') {
    fVar99 = (uu->field_0).v[0];
    fVar100 = (uu->field_0).v[1];
    fVar101 = (uu->field_0).v[2];
    fVar102 = (uu->field_0).v[3];
    fVar53 = 1.0 - fVar99;
    fVar58 = 1.0 - fVar100;
    fVar62 = 1.0 - fVar101;
    fVar66 = 1.0 - fVar102;
    fVar91 = (vv->field_0).v[0];
    fVar93 = (vv->field_0).v[1];
    fVar95 = (vv->field_0).v[2];
    fVar97 = (vv->field_0).v[3];
    fVar9 = 1.0 - fVar91;
    fVar14 = 1.0 - fVar93;
    fVar19 = 1.0 - fVar95;
    fVar24 = 1.0 - fVar97;
    fVar45 = fVar53 * fVar53 * fVar53;
    fVar47 = fVar58 * fVar58 * fVar58;
    fVar49 = fVar62 * fVar62 * fVar62;
    fVar51 = fVar66 * fVar66 * fVar66;
    fVar29 = fVar9 * fVar9 * fVar9;
    fVar33 = fVar14 * fVar14 * fVar14;
    fVar37 = fVar19 * fVar19 * fVar19;
    fVar41 = fVar24 * fVar24 * fVar24;
    fVar54 = fVar53 * fVar99 * fVar53 * 3.0;
    fVar59 = fVar58 * fVar100 * fVar58 * 3.0;
    fVar63 = fVar62 * fVar101 * fVar62 * 3.0;
    fVar67 = fVar66 * fVar102 * fVar66 * 3.0;
    fVar10 = fVar9 * fVar91 * fVar9 * 3.0;
    fVar15 = fVar14 * fVar93 * fVar14 * 3.0;
    fVar20 = fVar19 * fVar95 * fVar19 * 3.0;
    fVar25 = fVar24 * fVar97 * fVar24 * 3.0;
    fVar83 = fVar99 * fVar53 * fVar99 * 3.0;
    fVar85 = fVar100 * fVar58 * fVar100 * 3.0;
    fVar87 = fVar101 * fVar62 * fVar101 * 3.0;
    fVar89 = fVar102 * fVar66 * fVar102 * 3.0;
    fVar69 = fVar91 * fVar9 * fVar91 * 3.0;
    fVar72 = fVar93 * fVar14 * fVar93 * 3.0;
    fVar76 = fVar95 * fVar19 * fVar95 * 3.0;
    fVar80 = fVar97 * fVar24 * fVar97 * 3.0;
    fVar99 = fVar99 * fVar99 * fVar99;
    fVar100 = fVar100 * fVar100 * fVar100;
    fVar101 = fVar101 * fVar101 * fVar101;
    fVar102 = fVar102 * fVar102 * fVar102;
    fVar91 = fVar91 * fVar91 * fVar91;
    fVar93 = fVar93 * fVar93 * fVar93;
    fVar95 = fVar95 * fVar95 * fVar95;
    fVar97 = fVar97 * fVar97 * fVar97;
    fVar14 = patch->patch_v[0][0].field_0.m128[0];
    fVar19 = patch->patch_v[0][1].field_0.m128[0];
    fVar24 = patch->patch_v[0][2].field_0.m128[0];
    fVar53 = patch->patch_v[0][3].field_0.m128[0];
    fVar58 = patch->patch_v[1][0].field_0.m128[0];
    fVar62 = patch->patch_v[1][1].field_0.m128[0];
    fVar66 = patch->patch_v[1][2].field_0.m128[0];
    fVar56 = patch->patch_v[1][3].field_0.m128[0];
    fVar61 = patch->patch_v[2][0].field_0.m128[0];
    fVar65 = patch->patch_v[2][1].field_0.m128[0];
    fVar71 = patch->patch_v[2][2].field_0.m128[0];
    fVar75 = patch->patch_v[2][3].field_0.m128[0];
    fVar79 = patch->patch_v[3][0].field_0.m128[0];
    fVar84 = patch->patch_v[3][2].field_0.m128[0];
    fVar86 = patch->patch_v[3][3].field_0.m128[0];
    fVar88 = patch->patch_v[3][1].field_0.m128[0];
    fVar90 = patch->patch_v[0][0].field_0.m128[1];
    fVar3 = patch->patch_v[0][1].field_0.m128[1];
    fVar4 = patch->patch_v[0][2].field_0.m128[1];
    fVar5 = patch->patch_v[0][3].field_0.m128[1];
    fVar6 = patch->patch_v[1][0].field_0.m128[1];
    fVar7 = patch->patch_v[1][1].field_0.m128[1];
    fVar8 = patch->patch_v[1][2].field_0.m128[1];
    fVar11 = patch->patch_v[1][3].field_0.m128[1];
    fVar16 = patch->patch_v[2][0].field_0.m128[1];
    fVar21 = patch->patch_v[2][2].field_0.m128[1];
    fVar26 = patch->patch_v[2][3].field_0.m128[1];
    fVar30 = patch->patch_v[2][1].field_0.m128[1];
    fVar34 = patch->patch_v[3][2].field_0.m128[1];
    fVar9 = patch->patch_v[3][3].field_0.m128[1];
    fVar38 = patch->patch_v[3][1].field_0.m128[1];
    fVar42 = patch->patch_v[3][0].field_0.m128[1];
    fVar103 = (fVar90 * fVar45 + fVar3 * fVar54 + fVar4 * fVar83 + fVar5 * fVar99) * fVar29 +
              (fVar6 * fVar45 + fVar7 * fVar54 + fVar8 * fVar83 + fVar11 * fVar99) * fVar10 +
              (fVar16 * fVar45 + fVar30 * fVar54 + fVar21 * fVar83 + fVar26 * fVar99) * fVar69 +
              (fVar42 * fVar45 + fVar38 * fVar54 + fVar34 * fVar83 + fVar9 * fVar99) * fVar91;
    fVar106 = (fVar90 * fVar47 + fVar3 * fVar59 + fVar4 * fVar85 + fVar5 * fVar100) * fVar33 +
              (fVar6 * fVar47 + fVar7 * fVar59 + fVar8 * fVar85 + fVar11 * fVar100) * fVar15 +
              (fVar16 * fVar47 + fVar30 * fVar59 + fVar21 * fVar85 + fVar26 * fVar100) * fVar72 +
              (fVar42 * fVar47 + fVar38 * fVar59 + fVar34 * fVar85 + fVar9 * fVar100) * fVar93;
    fVar108 = (fVar90 * fVar49 + fVar3 * fVar63 + fVar4 * fVar87 + fVar5 * fVar101) * fVar37 +
              (fVar6 * fVar49 + fVar7 * fVar63 + fVar8 * fVar87 + fVar11 * fVar101) * fVar20 +
              (fVar16 * fVar49 + fVar30 * fVar63 + fVar21 * fVar87 + fVar26 * fVar101) * fVar76 +
              (fVar42 * fVar49 + fVar38 * fVar63 + fVar34 * fVar87 + fVar9 * fVar101) * fVar95;
    fVar110 = (fVar90 * fVar51 + fVar3 * fVar67 + fVar4 * fVar89 + fVar5 * fVar102) * fVar41 +
              (fVar6 * fVar51 + fVar7 * fVar67 + fVar8 * fVar89 + fVar11 * fVar102) * fVar25 +
              (fVar16 * fVar51 + fVar30 * fVar67 + fVar21 * fVar89 + fVar26 * fVar102) * fVar80 +
              (fVar42 * fVar51 + fVar38 * fVar67 + fVar34 * fVar89 + fVar9 * fVar102) * fVar97;
    fVar90 = patch->patch_v[0][0].field_0.m128[2];
    fVar3 = patch->patch_v[0][1].field_0.m128[2];
    fVar4 = patch->patch_v[0][2].field_0.m128[2];
    fVar5 = patch->patch_v[0][3].field_0.m128[2];
    fVar6 = patch->patch_v[1][0].field_0.m128[2];
    fVar7 = patch->patch_v[1][2].field_0.m128[2];
    fVar8 = patch->patch_v[1][3].field_0.m128[2];
    fVar11 = patch->patch_v[1][1].field_0.m128[2];
    fVar16 = patch->patch_v[2][2].field_0.m128[2];
    fVar21 = patch->patch_v[2][3].field_0.m128[2];
    fVar26 = patch->patch_v[2][1].field_0.m128[2];
    fVar30 = patch->patch_v[2][0].field_0.m128[2];
    fVar9 = patch->patch_v[3][3].field_0.m128[2];
    fVar34 = patch->patch_v[3][2].field_0.m128[2];
    fVar38 = patch->patch_v[3][1].field_0.m128[2];
    fVar42 = patch->patch_v[3][0].field_0.m128[2];
    fVar112 = (fVar90 * fVar45 + fVar3 * fVar54 + fVar4 * fVar83 + fVar5 * fVar99) * fVar29 +
              (fVar6 * fVar45 + fVar11 * fVar54 + fVar7 * fVar83 + fVar8 * fVar99) * fVar10 +
              (fVar30 * fVar45 + fVar26 * fVar54 + fVar16 * fVar83 + fVar21 * fVar99) * fVar69 +
              (fVar42 * fVar45 + fVar38 * fVar54 + fVar34 * fVar83 + fVar9 * fVar99) * fVar91;
    fVar114 = (fVar90 * fVar47 + fVar3 * fVar59 + fVar4 * fVar85 + fVar5 * fVar100) * fVar33 +
              (fVar6 * fVar47 + fVar11 * fVar59 + fVar7 * fVar85 + fVar8 * fVar100) * fVar15 +
              (fVar30 * fVar47 + fVar26 * fVar59 + fVar16 * fVar85 + fVar21 * fVar100) * fVar72 +
              (fVar42 * fVar47 + fVar38 * fVar59 + fVar34 * fVar85 + fVar9 * fVar100) * fVar93;
    fVar116 = (fVar90 * fVar49 + fVar3 * fVar63 + fVar4 * fVar87 + fVar5 * fVar101) * fVar37 +
              (fVar6 * fVar49 + fVar11 * fVar63 + fVar7 * fVar87 + fVar8 * fVar101) * fVar20 +
              (fVar30 * fVar49 + fVar26 * fVar63 + fVar16 * fVar87 + fVar21 * fVar101) * fVar76 +
              (fVar42 * fVar49 + fVar38 * fVar63 + fVar34 * fVar87 + fVar9 * fVar101) * fVar95;
    fVar9 = (fVar90 * fVar51 + fVar3 * fVar67 + fVar4 * fVar89 + fVar5 * fVar102) * fVar41 +
            (fVar6 * fVar51 + fVar11 * fVar67 + fVar7 * fVar89 + fVar8 * fVar102) * fVar25 +
            (fVar30 * fVar51 + fVar26 * fVar67 + fVar16 * fVar89 + fVar21 * fVar102) * fVar80 +
            (fVar42 * fVar51 + fVar38 * fVar67 + fVar34 * fVar89 + fVar9 * fVar102) * fVar97;
    *(float *)&in_RDI->field_0 =
         (fVar14 * fVar45 + fVar19 * fVar54 + fVar24 * fVar83 + fVar53 * fVar99) * fVar29 +
         (fVar58 * fVar45 + fVar62 * fVar54 + fVar66 * fVar83 + fVar56 * fVar99) * fVar10 +
         (fVar61 * fVar45 + fVar65 * fVar54 + fVar71 * fVar83 + fVar75 * fVar99) * fVar69 +
         (fVar79 * fVar45 + fVar88 * fVar54 + fVar84 * fVar83 + fVar86 * fVar99) * fVar91;
    *(float *)((long)&in_RDI->field_0 + 4) =
         (fVar14 * fVar47 + fVar19 * fVar59 + fVar24 * fVar85 + fVar53 * fVar100) * fVar33 +
         (fVar58 * fVar47 + fVar62 * fVar59 + fVar66 * fVar85 + fVar56 * fVar100) * fVar15 +
         (fVar61 * fVar47 + fVar65 * fVar59 + fVar71 * fVar85 + fVar75 * fVar100) * fVar72 +
         (fVar79 * fVar47 + fVar88 * fVar59 + fVar84 * fVar85 + fVar86 * fVar100) * fVar93;
    *(float *)((long)&in_RDI->field_0 + 8) =
         (fVar14 * fVar49 + fVar19 * fVar63 + fVar24 * fVar87 + fVar53 * fVar101) * fVar37 +
         (fVar58 * fVar49 + fVar62 * fVar63 + fVar66 * fVar87 + fVar56 * fVar101) * fVar20 +
         (fVar61 * fVar49 + fVar65 * fVar63 + fVar71 * fVar87 + fVar75 * fVar101) * fVar76 +
         (fVar79 * fVar49 + fVar88 * fVar63 + fVar84 * fVar87 + fVar86 * fVar101) * fVar95;
    *(float *)((long)&in_RDI->field_0 + 0xc) =
         (fVar14 * fVar51 + fVar19 * fVar67 + fVar24 * fVar89 + fVar53 * fVar102) * fVar41 +
         (fVar58 * fVar51 + fVar62 * fVar67 + fVar66 * fVar89 + fVar56 * fVar102) * fVar25 +
         (fVar61 * fVar51 + fVar65 * fVar67 + fVar71 * fVar89 + fVar75 * fVar102) * fVar80 +
         (fVar79 * fVar51 + fVar88 * fVar67 + fVar84 * fVar89 + fVar86 * fVar102) * fVar97;
  }
  else {
    if (uVar1 != '\x01') {
      if (uVar1 == '\x03') {
        fVar100 = patch->patch_v[0][0].field_0.m128[3];
        fVar101 = patch->patch_v[0][1].field_0.m128[3];
        fVar102 = patch->patch_v[0][2].field_0.m128[3];
        fVar91 = (uu->field_0).v[0];
        fVar93 = (uu->field_0).v[1];
        fVar95 = (uu->field_0).v[2];
        fVar97 = (uu->field_0).v[3];
        fVar104 = 1.0 - fVar91;
        fVar107 = 1.0 - fVar93;
        fVar109 = 1.0 - fVar95;
        fVar111 = 1.0 - fVar97;
        fVar14 = (vv->field_0).v[0];
        fVar19 = (vv->field_0).v[1];
        fVar24 = (vv->field_0).v[2];
        fVar53 = (vv->field_0).v[3];
        uVar126 = -(uint)((fVar14 != 0.0 && fVar14 != 1.0) && (fVar91 != 1.0 && fVar91 != 0.0));
        uVar127 = -(uint)((fVar19 != 0.0 && fVar19 != 1.0) && (fVar93 != 1.0 && fVar93 != 0.0));
        uVar128 = -(uint)((fVar24 != 0.0 && fVar24 != 1.0) && (fVar95 != 1.0 && fVar95 != 0.0));
        uVar129 = -(uint)((fVar53 != 0.0 && fVar53 != 1.0) && (fVar97 != 1.0 && fVar97 != 0.0));
        fVar58 = patch->patch_v[1][1].field_0.m128[0];
        fVar62 = patch->patch_v[1][1].field_0.m128[1];
        auVar12._4_4_ = fVar62;
        auVar12._0_4_ = fVar62;
        auVar12._8_4_ = fVar62;
        auVar12._12_4_ = fVar62;
        fVar66 = patch->patch_v[1][1].field_0.m128[2];
        auVar2._4_4_ = fVar93 + fVar19;
        auVar2._0_4_ = fVar91 + fVar14;
        auVar2._8_4_ = fVar95 + fVar24;
        auVar2._12_4_ = fVar97 + fVar53;
        auVar13 = rcpps(auVar12,auVar2);
        fVar112 = auVar13._0_4_;
        fVar73 = auVar13._4_4_;
        fVar77 = auVar13._8_4_;
        fVar81 = auVar13._12_4_;
        fVar56 = patch->patch_v[1][0].field_0.m128[3];
        fVar112 = (1.0 - (fVar91 + fVar14) * fVar112) * fVar112 + fVar112;
        fVar73 = (1.0 - (fVar93 + fVar19) * fVar73) * fVar73 + fVar73;
        fVar77 = (1.0 - (fVar95 + fVar24) * fVar77) * fVar77 + fVar77;
        fVar81 = (1.0 - (fVar97 + fVar53) * fVar81) * fVar81 + fVar81;
        fVar61 = patch->patch_v[1][1].field_0.m128[3];
        fVar65 = patch->patch_v[1][2].field_0.m128[0];
        fVar71 = patch->patch_v[1][2].field_0.m128[1];
        fVar31 = 1.0 - fVar14;
        fVar35 = 1.0 - fVar19;
        fVar39 = 1.0 - fVar24;
        fVar43 = 1.0 - fVar53;
        fVar75 = patch->patch_v[3][0].field_0.m128[3];
        fVar79 = patch->patch_v[3][1].field_0.m128[3];
        fVar84 = patch->patch_v[3][2].field_0.m128[3];
        fVar86 = patch->patch_v[1][2].field_0.m128[3];
        fVar46 = fVar104 * fVar104 * fVar104;
        fVar48 = fVar107 * fVar107 * fVar107;
        fVar50 = fVar109 * fVar109 * fVar109;
        fVar52 = fVar111 * fVar111 * fVar111;
        fVar114 = fVar91 * fVar91 * fVar91;
        fVar17 = fVar93 * fVar93 * fVar93;
        fVar22 = fVar95 * fVar95 * fVar95;
        fVar27 = fVar97 * fVar97 * fVar97;
        fVar88 = patch->patch_v[2][0].field_0.m128[3];
        fVar90 = patch->patch_v[2][1].field_0.m128[3];
        fVar3 = patch->patch_v[2][2].field_0.m128[3];
        auVar119._0_4_ = fVar104 + fVar31;
        auVar119._4_4_ = fVar107 + fVar35;
        auVar119._8_4_ = fVar109 + fVar39;
        auVar119._12_4_ = fVar111 + fVar43;
        auVar121._0_4_ = fVar91 + fVar31;
        auVar121._4_4_ = fVar93 + fVar35;
        auVar121._8_4_ = fVar95 + fVar39;
        auVar121._12_4_ = fVar97 + fVar43;
        fVar32 = fVar31 * fVar31 * fVar31;
        fVar36 = fVar35 * fVar35 * fVar35;
        fVar40 = fVar39 * fVar39 * fVar39;
        fVar44 = fVar43 * fVar43 * fVar43;
        auVar105._0_4_ = fVar14 * fVar14 * fVar14;
        auVar105._4_4_ = fVar19 * fVar19 * fVar19;
        auVar105._8_4_ = fVar24 * fVar24 * fVar24;
        auVar105._12_4_ = fVar53 * fVar53 * fVar53;
        fVar4 = patch->patch_v[1][2].field_0.m128[2];
        auVar13._4_4_ = fVar107 + fVar19;
        auVar13._0_4_ = fVar104 + fVar14;
        auVar13._8_4_ = fVar109 + fVar24;
        auVar13._12_4_ = fVar111 + fVar53;
        auVar13 = rcpps(auVar105,auVar13);
        fVar122 = auVar13._0_4_;
        fVar123 = auVar13._4_4_;
        fVar124 = auVar13._8_4_;
        fVar125 = auVar13._12_4_;
        fVar122 = (1.0 - (fVar104 + fVar14) * fVar122) * fVar122 + fVar122;
        fVar123 = (1.0 - (fVar107 + fVar19) * fVar123) * fVar123 + fVar123;
        fVar124 = (1.0 - (fVar109 + fVar24) * fVar124) * fVar124 + fVar124;
        fVar125 = (1.0 - (fVar111 + fVar53) * fVar125) * fVar125 + fVar125;
        fVar5 = patch->patch_v[2][2].field_0.m128[0];
        fVar6 = patch->patch_v[2][2].field_0.m128[1];
        fVar7 = patch->patch_v[2][2].field_0.m128[2];
        auVar57._4_4_ = fVar7;
        auVar57._0_4_ = fVar7;
        auVar57._8_4_ = fVar7;
        auVar57._12_4_ = fVar7;
        auVar13 = rcpps(auVar57,auVar119);
        fVar113 = auVar13._0_4_;
        auVar120._0_4_ = auVar119._0_4_ * fVar113;
        fVar115 = auVar13._4_4_;
        auVar120._4_4_ = auVar119._4_4_ * fVar115;
        fVar117 = auVar13._8_4_;
        auVar120._8_4_ = auVar119._8_4_ * fVar117;
        fVar118 = auVar13._12_4_;
        auVar120._12_4_ = auVar119._12_4_ * fVar118;
        fVar113 = (1.0 - auVar120._0_4_) * fVar113 + fVar113;
        fVar115 = (1.0 - auVar120._4_4_) * fVar115 + fVar115;
        fVar117 = (1.0 - auVar120._8_4_) * fVar117 + fVar117;
        fVar118 = (1.0 - auVar120._12_4_) * fVar118 + fVar118;
        fVar8 = patch->patch_v[2][1].field_0.m128[0];
        fVar11 = patch->patch_v[2][1].field_0.m128[1];
        fVar16 = patch->patch_v[2][1].field_0.m128[2];
        auVar13 = rcpps(auVar120,auVar121);
        fVar55 = auVar13._0_4_;
        fVar60 = auVar13._4_4_;
        fVar64 = auVar13._8_4_;
        fVar68 = auVar13._12_4_;
        fVar55 = (1.0 - auVar121._0_4_ * fVar55) * fVar55 + fVar55;
        fVar60 = (1.0 - auVar121._4_4_ * fVar60) * fVar60 + fVar60;
        fVar64 = (1.0 - auVar121._8_4_ * fVar64) * fVar64 + fVar64;
        fVar68 = (1.0 - auVar121._12_4_ * fVar68) * fVar68 + fVar68;
        fVar70 = fVar104 * fVar91 * fVar104 * 3.0;
        fVar74 = fVar107 * fVar93 * fVar107 * 3.0;
        fVar78 = fVar109 * fVar95 * fVar109 * 3.0;
        fVar82 = fVar111 * fVar97 * fVar111 * 3.0;
        fVar92 = fVar31 * fVar14 * fVar31 * 3.0;
        fVar94 = fVar35 * fVar19 * fVar35 * 3.0;
        fVar96 = fVar39 * fVar24 * fVar39 * 3.0;
        fVar98 = fVar43 * fVar53 * fVar43 * 3.0;
        fVar130 = fVar91 * fVar104 * fVar91 * 3.0;
        fVar131 = fVar93 * fVar107 * fVar93 * 3.0;
        fVar132 = fVar95 * fVar109 * fVar95 * 3.0;
        fVar133 = fVar97 * fVar111 * fVar97 * 3.0;
        fVar116 = fVar14 * fVar31 * fVar14 * 3.0;
        fVar18 = fVar19 * fVar35 * fVar19 * 3.0;
        fVar23 = fVar24 * fVar39 * fVar24 * 3.0;
        fVar28 = fVar53 * fVar43 * fVar53 * 3.0;
        fVar21 = patch->patch_v[0][2].field_0.m128[0];
        fVar26 = patch->patch_v[0][3].field_0.m128[0];
        fVar30 = patch->patch_v[0][1].field_0.m128[0];
        fVar34 = patch->patch_v[0][0].field_0.m128[0];
        fVar38 = patch->patch_v[1][3].field_0.m128[0];
        fVar42 = patch->patch_v[1][0].field_0.m128[0];
        fVar10 = patch->patch_v[2][3].field_0.m128[0];
        fVar15 = patch->patch_v[2][0].field_0.m128[0];
        fVar20 = patch->patch_v[3][2].field_0.m128[0];
        fVar25 = patch->patch_v[3][3].field_0.m128[0];
        fVar29 = patch->patch_v[3][1].field_0.m128[0];
        fVar33 = patch->patch_v[3][0].field_0.m128[0];
        fVar37 = patch->patch_v[0][2].field_0.m128[1];
        fVar41 = patch->patch_v[0][3].field_0.m128[1];
        fVar45 = patch->patch_v[0][1].field_0.m128[1];
        fVar47 = patch->patch_v[0][0].field_0.m128[1];
        fVar49 = patch->patch_v[1][3].field_0.m128[1];
        fVar51 = patch->patch_v[1][0].field_0.m128[1];
        fVar54 = patch->patch_v[2][3].field_0.m128[1];
        fVar59 = patch->patch_v[2][0].field_0.m128[1];
        fVar63 = patch->patch_v[3][2].field_0.m128[1];
        fVar9 = patch->patch_v[3][3].field_0.m128[1];
        fVar67 = patch->patch_v[3][1].field_0.m128[1];
        fVar69 = patch->patch_v[3][0].field_0.m128[1];
        fVar72 = patch->patch_v[0][2].field_0.m128[2];
        fVar76 = patch->patch_v[0][3].field_0.m128[2];
        fVar80 = patch->patch_v[0][1].field_0.m128[2];
        fVar83 = patch->patch_v[0][0].field_0.m128[2];
        fVar85 = patch->patch_v[1][3].field_0.m128[2];
        fVar87 = patch->patch_v[1][0].field_0.m128[2];
        fVar89 = patch->patch_v[2][3].field_0.m128[2];
        fVar103 = patch->patch_v[2][0].field_0.m128[2];
        fVar99 = patch->patch_v[3][3].field_0.m128[2];
        fVar106 = patch->patch_v[3][2].field_0.m128[2];
        fVar108 = patch->patch_v[3][1].field_0.m128[2];
        fVar110 = patch->patch_v[3][0].field_0.m128[2];
        *(float *)&in_RDI->field_0 =
             (fVar34 * fVar46 + fVar30 * fVar70 + fVar21 * fVar130 + fVar26 * fVar114) * fVar32 +
             (fVar42 * fVar46 +
             (float)(~uVar126 & (uint)fVar58 |
                    (uint)((fVar100 * fVar14 + fVar91 * fVar58) * fVar112) & uVar126) * fVar70 +
             (float)(~uVar126 & (uint)fVar65 |
                    (uint)((fVar14 * fVar65 + fVar56 * fVar104) * fVar122) & uVar126) * fVar130 +
             fVar38 * fVar114) * fVar92 +
             (fVar15 * fVar46 +
             (float)(~uVar126 & (uint)fVar8 |
                    (uint)((fVar31 * fVar8 + fVar75 * fVar91) * fVar55) & uVar126) * fVar70 +
             (float)(~uVar126 & (uint)fVar5 |
                    (uint)((fVar88 * fVar31 + fVar104 * fVar5) * fVar113) & uVar126) * fVar130 +
             fVar10 * fVar114) * fVar116 +
             (fVar33 * fVar46 + fVar29 * fVar70 + fVar20 * fVar130 + fVar25 * fVar114) *
             auVar105._0_4_;
        *(float *)((long)&in_RDI->field_0 + 4) =
             (fVar34 * fVar48 + fVar30 * fVar74 + fVar21 * fVar131 + fVar26 * fVar17) * fVar36 +
             (fVar42 * fVar48 +
             (float)(~uVar127 & (uint)fVar58 |
                    (uint)((fVar100 * fVar19 + fVar93 * fVar58) * fVar73) & uVar127) * fVar74 +
             (float)(~uVar127 & (uint)fVar65 |
                    (uint)((fVar19 * fVar65 + fVar56 * fVar107) * fVar123) & uVar127) * fVar131 +
             fVar38 * fVar17) * fVar94 +
             (fVar15 * fVar48 +
             (float)(~uVar127 & (uint)fVar8 |
                    (uint)((fVar35 * fVar8 + fVar75 * fVar93) * fVar60) & uVar127) * fVar74 +
             (float)(~uVar127 & (uint)fVar5 |
                    (uint)((fVar88 * fVar35 + fVar107 * fVar5) * fVar115) & uVar127) * fVar131 +
             fVar10 * fVar17) * fVar18 +
             (fVar33 * fVar48 + fVar29 * fVar74 + fVar20 * fVar131 + fVar25 * fVar17) *
             auVar105._4_4_;
        *(float *)((long)&in_RDI->field_0 + 8) =
             (fVar34 * fVar50 + fVar30 * fVar78 + fVar21 * fVar132 + fVar26 * fVar22) * fVar40 +
             (fVar42 * fVar50 +
             (float)(~uVar128 & (uint)fVar58 |
                    (uint)((fVar100 * fVar24 + fVar95 * fVar58) * fVar77) & uVar128) * fVar78 +
             (float)(~uVar128 & (uint)fVar65 |
                    (uint)((fVar24 * fVar65 + fVar56 * fVar109) * fVar124) & uVar128) * fVar132 +
             fVar38 * fVar22) * fVar96 +
             (fVar15 * fVar50 +
             (float)(~uVar128 & (uint)fVar8 |
                    (uint)((fVar39 * fVar8 + fVar75 * fVar95) * fVar64) & uVar128) * fVar78 +
             (float)(~uVar128 & (uint)fVar5 |
                    (uint)((fVar88 * fVar39 + fVar109 * fVar5) * fVar117) & uVar128) * fVar132 +
             fVar10 * fVar22) * fVar23 +
             (fVar33 * fVar50 + fVar29 * fVar78 + fVar20 * fVar132 + fVar25 * fVar22) *
             auVar105._8_4_;
        *(float *)((long)&in_RDI->field_0 + 0xc) =
             (fVar34 * fVar52 + fVar30 * fVar82 + fVar21 * fVar133 + fVar26 * fVar27) * fVar44 +
             (fVar42 * fVar52 +
             (float)(~uVar129 & (uint)fVar58 |
                    (uint)((fVar100 * fVar53 + fVar97 * fVar58) * fVar81) & uVar129) * fVar82 +
             (float)(~uVar129 & (uint)fVar65 |
                    (uint)((fVar53 * fVar65 + fVar56 * fVar111) * fVar125) & uVar129) * fVar133 +
             fVar38 * fVar27) * fVar98 +
             (fVar15 * fVar52 +
             (float)(~uVar129 & (uint)fVar8 |
                    (uint)((fVar43 * fVar8 + fVar75 * fVar97) * fVar68) & uVar129) * fVar82 +
             (float)(~uVar129 & (uint)fVar5 |
                    (uint)((fVar88 * fVar43 + fVar111 * fVar5) * fVar118) & uVar129) * fVar133 +
             fVar10 * fVar27) * fVar28 +
             (fVar33 * fVar52 + fVar29 * fVar82 + fVar20 * fVar133 + fVar25 * fVar27) *
             auVar105._12_4_;
        *(float *)((long)&in_RDI->field_0 + 0x10) =
             (fVar47 * fVar46 + fVar45 * fVar70 + fVar37 * fVar130 + fVar41 * fVar114) * fVar32 +
             (fVar51 * fVar46 +
             (float)(~uVar126 & (uint)fVar62 |
                    (uint)((fVar101 * fVar14 + fVar91 * fVar62) * fVar112) & uVar126) * fVar70 +
             (float)(~uVar126 & (uint)fVar71 |
                    (uint)((fVar14 * fVar71 + fVar61 * fVar104) * fVar122) & uVar126) * fVar130 +
             fVar49 * fVar114) * fVar92 +
             (fVar59 * fVar46 +
             (float)(~uVar126 & (uint)fVar11 |
                    (uint)((fVar31 * fVar11 + fVar79 * fVar91) * fVar55) & uVar126) * fVar70 +
             (float)(~uVar126 & (uint)fVar6 |
                    (uint)((fVar90 * fVar31 + fVar104 * fVar6) * fVar113) & uVar126) * fVar130 +
             fVar54 * fVar114) * fVar116 +
             (fVar69 * fVar46 + fVar67 * fVar70 + fVar63 * fVar130 + fVar9 * fVar114) *
             auVar105._0_4_;
        *(float *)((long)&in_RDI->field_0 + 0x14) =
             (fVar47 * fVar48 + fVar45 * fVar74 + fVar37 * fVar131 + fVar41 * fVar17) * fVar36 +
             (fVar51 * fVar48 +
             (float)(~uVar127 & (uint)fVar62 |
                    (uint)((fVar101 * fVar19 + fVar93 * fVar62) * fVar73) & uVar127) * fVar74 +
             (float)(~uVar127 & (uint)fVar71 |
                    (uint)((fVar19 * fVar71 + fVar61 * fVar107) * fVar123) & uVar127) * fVar131 +
             fVar49 * fVar17) * fVar94 +
             (fVar59 * fVar48 +
             (float)(~uVar127 & (uint)fVar11 |
                    (uint)((fVar35 * fVar11 + fVar79 * fVar93) * fVar60) & uVar127) * fVar74 +
             (float)(~uVar127 & (uint)fVar6 |
                    (uint)((fVar90 * fVar35 + fVar107 * fVar6) * fVar115) & uVar127) * fVar131 +
             fVar54 * fVar17) * fVar18 +
             (fVar69 * fVar48 + fVar67 * fVar74 + fVar63 * fVar131 + fVar9 * fVar17) *
             auVar105._4_4_;
        *(float *)((long)&in_RDI->field_0 + 0x18) =
             (fVar47 * fVar50 + fVar45 * fVar78 + fVar37 * fVar132 + fVar41 * fVar22) * fVar40 +
             (fVar51 * fVar50 +
             (float)(~uVar128 & (uint)fVar62 |
                    (uint)((fVar101 * fVar24 + fVar95 * fVar62) * fVar77) & uVar128) * fVar78 +
             (float)(~uVar128 & (uint)fVar71 |
                    (uint)((fVar24 * fVar71 + fVar61 * fVar109) * fVar124) & uVar128) * fVar132 +
             fVar49 * fVar22) * fVar96 +
             (fVar59 * fVar50 +
             (float)(~uVar128 & (uint)fVar11 |
                    (uint)((fVar39 * fVar11 + fVar79 * fVar95) * fVar64) & uVar128) * fVar78 +
             (float)(~uVar128 & (uint)fVar6 |
                    (uint)((fVar90 * fVar39 + fVar109 * fVar6) * fVar117) & uVar128) * fVar132 +
             fVar54 * fVar22) * fVar23 +
             (fVar69 * fVar50 + fVar67 * fVar78 + fVar63 * fVar132 + fVar9 * fVar22) *
             auVar105._8_4_;
        *(float *)((long)&in_RDI->field_0 + 0x1c) =
             (fVar47 * fVar52 + fVar45 * fVar82 + fVar37 * fVar133 + fVar41 * fVar27) * fVar44 +
             (fVar51 * fVar52 +
             (float)(~uVar129 & (uint)fVar62 |
                    (uint)((fVar101 * fVar53 + fVar97 * fVar62) * fVar81) & uVar129) * fVar82 +
             (float)(~uVar129 & (uint)fVar71 |
                    (uint)((fVar53 * fVar71 + fVar61 * fVar111) * fVar125) & uVar129) * fVar133 +
             fVar49 * fVar27) * fVar98 +
             (fVar59 * fVar52 +
             (float)(~uVar129 & (uint)fVar11 |
                    (uint)((fVar43 * fVar11 + fVar79 * fVar97) * fVar68) & uVar129) * fVar82 +
             (float)(~uVar129 & (uint)fVar6 |
                    (uint)((fVar90 * fVar43 + fVar111 * fVar6) * fVar118) & uVar129) * fVar133 +
             fVar54 * fVar27) * fVar28 +
             (fVar69 * fVar52 + fVar67 * fVar82 + fVar63 * fVar133 + fVar9 * fVar27) *
             auVar105._12_4_;
        *(float *)((long)&in_RDI->field_0 + 0x20) =
             (fVar83 * fVar46 + fVar80 * fVar70 + fVar72 * fVar130 + fVar76 * fVar114) * fVar32 +
             (fVar87 * fVar46 +
             (float)(~uVar126 & (uint)fVar66 |
                    (uint)(fVar112 * (fVar102 * fVar14 + fVar91 * fVar66)) & uVar126) * fVar70 +
             (float)(~uVar126 & (uint)fVar4 |
                    (uint)(fVar122 * (fVar14 * fVar4 + fVar86 * fVar104)) & uVar126) * fVar130 +
             fVar85 * fVar114) * fVar92 +
             (fVar103 * fVar46 +
             (float)(~uVar126 & (uint)fVar16 |
                    (uint)(fVar55 * (fVar31 * fVar16 + fVar84 * fVar91)) & uVar126) * fVar70 +
             (float)(~uVar126 & (uint)fVar7 |
                    (uint)(fVar113 * (fVar3 * fVar31 + fVar104 * fVar7)) & uVar126) * fVar130 +
             fVar89 * fVar114) * fVar116 +
             (fVar110 * fVar46 + fVar108 * fVar70 + fVar106 * fVar130 + fVar99 * fVar114) *
             auVar105._0_4_;
        *(float *)((long)&in_RDI->field_0 + 0x24) =
             (fVar83 * fVar48 + fVar80 * fVar74 + fVar72 * fVar131 + fVar76 * fVar17) * fVar36 +
             (fVar87 * fVar48 +
             (float)(~uVar127 & (uint)fVar66 |
                    (uint)(fVar73 * (fVar102 * fVar19 + fVar93 * fVar66)) & uVar127) * fVar74 +
             (float)(~uVar127 & (uint)fVar4 |
                    (uint)(fVar123 * (fVar19 * fVar4 + fVar86 * fVar107)) & uVar127) * fVar131 +
             fVar85 * fVar17) * fVar94 +
             (fVar103 * fVar48 +
             (float)(~uVar127 & (uint)fVar16 |
                    (uint)(fVar60 * (fVar35 * fVar16 + fVar84 * fVar93)) & uVar127) * fVar74 +
             (float)(~uVar127 & (uint)fVar7 |
                    (uint)(fVar115 * (fVar3 * fVar35 + fVar107 * fVar7)) & uVar127) * fVar131 +
             fVar89 * fVar17) * fVar18 +
             (fVar110 * fVar48 + fVar108 * fVar74 + fVar106 * fVar131 + fVar99 * fVar17) *
             auVar105._4_4_;
        *(float *)((long)&in_RDI->field_0 + 0x28) =
             (fVar83 * fVar50 + fVar80 * fVar78 + fVar72 * fVar132 + fVar76 * fVar22) * fVar40 +
             (fVar87 * fVar50 +
             (float)(~uVar128 & (uint)fVar66 |
                    (uint)(fVar77 * (fVar102 * fVar24 + fVar95 * fVar66)) & uVar128) * fVar78 +
             (float)(~uVar128 & (uint)fVar4 |
                    (uint)(fVar124 * (fVar24 * fVar4 + fVar86 * fVar109)) & uVar128) * fVar132 +
             fVar85 * fVar22) * fVar96 +
             (fVar103 * fVar50 +
             (float)(~uVar128 & (uint)fVar16 |
                    (uint)(fVar64 * (fVar39 * fVar16 + fVar84 * fVar95)) & uVar128) * fVar78 +
             (float)(~uVar128 & (uint)fVar7 |
                    (uint)(fVar117 * (fVar3 * fVar39 + fVar109 * fVar7)) & uVar128) * fVar132 +
             fVar89 * fVar22) * fVar23 +
             (fVar110 * fVar50 + fVar108 * fVar78 + fVar106 * fVar132 + fVar99 * fVar22) *
             auVar105._8_4_;
        *(float *)((long)&in_RDI->field_0 + 0x2c) =
             (fVar83 * fVar52 + fVar80 * fVar82 + fVar72 * fVar133 + fVar76 * fVar27) * fVar44 +
             (fVar87 * fVar52 +
             (float)(~uVar129 & (uint)fVar66 |
                    (uint)(fVar81 * (fVar102 * fVar53 + fVar97 * fVar66)) & uVar129) * fVar82 +
             (float)(~uVar129 & (uint)fVar4 |
                    (uint)(fVar125 * (fVar53 * fVar4 + fVar86 * fVar111)) & uVar129) * fVar133 +
             fVar85 * fVar27) * fVar98 +
             (fVar103 * fVar52 +
             (float)(~uVar129 & (uint)fVar16 |
                    (uint)(fVar68 * (fVar43 * fVar16 + fVar84 * fVar97)) & uVar129) * fVar82 +
             (float)(~uVar129 & (uint)fVar7 |
                    (uint)(fVar118 * (fVar3 * fVar43 + fVar111 * fVar7)) & uVar129) * fVar133 +
             fVar89 * fVar27) * fVar28 +
             (fVar110 * fVar52 + fVar108 * fVar82 + fVar106 * fVar133 + fVar99 * fVar27) *
             auVar105._12_4_;
        return in_RDI;
      }
      if (uVar1 == '\x06') {
        fVar9 = patch->patch_v[0][0].field_0.m128[0];
        fVar91 = patch->patch_v[0][1].field_0.m128[0] - fVar9;
        fVar99 = (uu->field_0).v[0];
        fVar100 = (uu->field_0).v[1];
        fVar101 = (uu->field_0).v[2];
        fVar102 = (uu->field_0).v[3];
        fVar66 = fVar91 * fVar99 + fVar9;
        fVar61 = fVar91 * fVar100 + fVar9;
        fVar65 = fVar91 * fVar101 + fVar9;
        fVar9 = fVar91 * fVar102 + fVar9;
        fVar91 = patch->patch_v[0][3].field_0.m128[0];
        fVar62 = patch->patch_v[0][2].field_0.m128[0] - fVar91;
        fVar93 = (vv->field_0).v[0];
        fVar95 = (vv->field_0).v[1];
        fVar97 = (vv->field_0).v[2];
        fVar14 = (vv->field_0).v[3];
        fVar19 = patch->patch_v[0][0].field_0.m128[1];
        fVar24 = patch->patch_v[0][1].field_0.m128[1] - fVar19;
        fVar71 = fVar24 * fVar99 + fVar19;
        fVar75 = fVar24 * fVar100 + fVar19;
        fVar79 = fVar24 * fVar101 + fVar19;
        fVar19 = fVar24 * fVar102 + fVar19;
        fVar24 = patch->patch_v[0][3].field_0.m128[1];
        fVar56 = patch->patch_v[0][2].field_0.m128[1] - fVar24;
        fVar53 = patch->patch_v[0][0].field_0.m128[2];
        fVar58 = patch->patch_v[0][1].field_0.m128[2] - fVar53;
        fVar84 = fVar58 * fVar99 + fVar53;
        fVar86 = fVar58 * fVar100 + fVar53;
        fVar88 = fVar58 * fVar101 + fVar53;
        fVar53 = fVar58 * fVar102 + fVar53;
        fVar58 = patch->patch_v[0][3].field_0.m128[2];
        fVar90 = patch->patch_v[0][2].field_0.m128[2] - fVar58;
        *(float *)&in_RDI->field_0 = ((fVar62 * fVar99 + fVar91) - fVar66) * fVar93 + fVar66;
        *(float *)((long)&in_RDI->field_0 + 4) =
             ((fVar62 * fVar100 + fVar91) - fVar61) * fVar95 + fVar61;
        *(float *)((long)&in_RDI->field_0 + 8) =
             ((fVar62 * fVar101 + fVar91) - fVar65) * fVar97 + fVar65;
        *(float *)((long)&in_RDI->field_0 + 0xc) =
             ((fVar62 * fVar102 + fVar91) - fVar9) * fVar14 + fVar9;
        *(float *)((long)&in_RDI->field_0 + 0x10) =
             ((fVar56 * fVar99 + fVar24) - fVar71) * fVar93 + fVar71;
        *(float *)((long)&in_RDI->field_0 + 0x14) =
             ((fVar56 * fVar100 + fVar24) - fVar75) * fVar95 + fVar75;
        *(float *)((long)&in_RDI->field_0 + 0x18) =
             ((fVar56 * fVar101 + fVar24) - fVar79) * fVar97 + fVar79;
        *(float *)((long)&in_RDI->field_0 + 0x1c) =
             ((fVar56 * fVar102 + fVar24) - fVar19) * fVar14 + fVar19;
        *(float *)((long)&in_RDI->field_0 + 0x20) =
             ((fVar90 * fVar99 + fVar58) - fVar84) * fVar93 + fVar84;
        *(float *)((long)&in_RDI->field_0 + 0x24) =
             ((fVar90 * fVar100 + fVar58) - fVar86) * fVar95 + fVar86;
        *(float *)((long)&in_RDI->field_0 + 0x28) =
             ((fVar90 * fVar101 + fVar58) - fVar88) * fVar97 + fVar88;
        *(float *)((long)&in_RDI->field_0 + 0x2c) =
             ((fVar90 * fVar102 + fVar58) - fVar53) * fVar14 + fVar53;
        return in_RDI;
      }
      *(undefined8 *)((long)&in_RDI->field_0 + 0x20) = 0;
      *(undefined8 *)((long)&in_RDI->field_0 + 0x28) = 0;
      *(undefined8 *)((long)&in_RDI->field_0 + 0x10) = 0;
      *(undefined8 *)((long)&in_RDI->field_0 + 0x18) = 0;
      *(undefined8 *)&in_RDI->field_0 = 0;
      *(undefined8 *)((long)&in_RDI->field_0 + 8) = 0;
      return in_RDI;
    }
    fVar9 = (uu->field_0).v[0];
    fVar99 = (uu->field_0).v[1];
    fVar100 = (uu->field_0).v[2];
    fVar101 = (uu->field_0).v[3];
    fVar97 = 1.0 - fVar9;
    fVar19 = 1.0 - fVar99;
    fVar53 = 1.0 - fVar100;
    fVar62 = 1.0 - fVar101;
    fVar102 = fVar97 * fVar97 * fVar97;
    fVar91 = fVar19 * fVar19 * fVar19;
    fVar93 = fVar53 * fVar53 * fVar53;
    fVar95 = fVar62 * fVar62 * fVar62;
    fVar10 = fVar9 * fVar9 * fVar9;
    fVar15 = fVar99 * fVar99 * fVar99;
    fVar20 = fVar100 * fVar100 * fVar100;
    fVar25 = fVar101 * fVar101 * fVar101;
    fVar14 = fVar97 * fVar9 * fVar97;
    fVar24 = fVar19 * fVar99 * fVar19;
    fVar58 = fVar53 * fVar100 * fVar53;
    fVar66 = fVar62 * fVar101 * fVar62;
    fVar9 = fVar9 * fVar97 * fVar9;
    fVar99 = fVar99 * fVar19 * fVar99;
    fVar100 = fVar100 * fVar53 * fVar100;
    fVar101 = fVar101 * fVar62 * fVar101;
    fVar11 = fVar102 * 0.16666667;
    fVar16 = fVar91 * 0.16666667;
    fVar21 = fVar93 * 0.16666667;
    fVar26 = fVar95 * 0.16666667;
    fVar45 = (fVar9 * 6.0 + fVar14 * 12.0 + fVar102 * 4.0 + fVar10) * 0.16666667;
    fVar47 = (fVar99 * 6.0 + fVar24 * 12.0 + fVar91 * 4.0 + fVar15) * 0.16666667;
    fVar49 = (fVar100 * 6.0 + fVar58 * 12.0 + fVar93 * 4.0 + fVar20) * 0.16666667;
    fVar51 = (fVar101 * 6.0 + fVar66 * 12.0 + fVar95 * 4.0 + fVar25) * 0.16666667;
    fVar30 = (fVar14 * 6.0 + fVar9 * 12.0 + fVar10 * 4.0 + fVar102) * 0.16666667;
    fVar34 = (fVar24 * 6.0 + fVar99 * 12.0 + fVar15 * 4.0 + fVar91) * 0.16666667;
    fVar38 = (fVar58 * 6.0 + fVar100 * 12.0 + fVar20 * 4.0 + fVar93) * 0.16666667;
    fVar42 = (fVar66 * 6.0 + fVar101 * 12.0 + fVar25 * 4.0 + fVar95) * 0.16666667;
    fVar10 = fVar10 * 0.16666667;
    fVar15 = fVar15 * 0.16666667;
    fVar20 = fVar20 * 0.16666667;
    fVar25 = fVar25 * 0.16666667;
    fVar9 = (vv->field_0).v[0];
    fVar99 = (vv->field_0).v[1];
    fVar100 = (vv->field_0).v[2];
    fVar101 = (vv->field_0).v[3];
    fVar102 = 1.0 - fVar9;
    fVar93 = 1.0 - fVar99;
    fVar97 = 1.0 - fVar100;
    fVar19 = 1.0 - fVar101;
    fVar53 = fVar102 * fVar102 * fVar102;
    fVar58 = fVar93 * fVar93 * fVar93;
    fVar62 = fVar97 * fVar97 * fVar97;
    fVar66 = fVar19 * fVar19 * fVar19;
    fVar69 = fVar9 * fVar9 * fVar9;
    fVar72 = fVar99 * fVar99 * fVar99;
    fVar76 = fVar100 * fVar100 * fVar100;
    fVar80 = fVar101 * fVar101 * fVar101;
    fVar91 = fVar102 * fVar9 * fVar102;
    fVar95 = fVar93 * fVar99 * fVar93;
    fVar14 = fVar97 * fVar100 * fVar97;
    fVar24 = fVar19 * fVar101 * fVar19;
    fVar9 = fVar9 * fVar102 * fVar9;
    fVar99 = fVar99 * fVar93 * fVar99;
    fVar100 = fVar100 * fVar97 * fVar100;
    fVar101 = fVar101 * fVar19 * fVar101;
    fVar54 = fVar53 * 0.16666667;
    fVar59 = fVar58 * 0.16666667;
    fVar63 = fVar62 * 0.16666667;
    fVar67 = fVar66 * 0.16666667;
    fVar83 = (fVar9 * 6.0 + fVar91 * 12.0 + fVar53 * 4.0 + fVar69) * 0.16666667;
    fVar85 = (fVar99 * 6.0 + fVar95 * 12.0 + fVar58 * 4.0 + fVar72) * 0.16666667;
    fVar87 = (fVar100 * 6.0 + fVar14 * 12.0 + fVar62 * 4.0 + fVar76) * 0.16666667;
    fVar89 = (fVar101 * 6.0 + fVar24 * 12.0 + fVar66 * 4.0 + fVar80) * 0.16666667;
    fVar29 = (fVar91 * 6.0 + fVar9 * 12.0 + fVar69 * 4.0 + fVar53) * 0.16666667;
    fVar33 = (fVar95 * 6.0 + fVar99 * 12.0 + fVar72 * 4.0 + fVar58) * 0.16666667;
    fVar37 = (fVar14 * 6.0 + fVar100 * 12.0 + fVar76 * 4.0 + fVar62) * 0.16666667;
    fVar41 = (fVar24 * 6.0 + fVar101 * 12.0 + fVar80 * 4.0 + fVar66) * 0.16666667;
    fVar69 = fVar69 * 0.16666667;
    fVar72 = fVar72 * 0.16666667;
    fVar76 = fVar76 * 0.16666667;
    fVar80 = fVar80 * 0.16666667;
    fVar99 = patch->patch_v[0][0].field_0.m128[0];
    fVar100 = patch->patch_v[1][0].field_0.m128[0];
    fVar101 = patch->patch_v[2][0].field_0.m128[0];
    fVar102 = patch->patch_v[3][0].field_0.m128[0];
    fVar91 = patch->patch_v[0][1].field_0.m128[0];
    fVar93 = patch->patch_v[1][1].field_0.m128[0];
    fVar95 = patch->patch_v[2][1].field_0.m128[0];
    fVar97 = patch->patch_v[3][1].field_0.m128[0];
    fVar14 = patch->patch_v[0][2].field_0.m128[0];
    fVar19 = patch->patch_v[1][2].field_0.m128[0];
    fVar24 = patch->patch_v[2][2].field_0.m128[0];
    fVar53 = patch->patch_v[3][2].field_0.m128[0];
    fVar58 = patch->patch_v[0][3].field_0.m128[0];
    fVar62 = patch->patch_v[2][3].field_0.m128[0];
    fVar66 = patch->patch_v[3][3].field_0.m128[0];
    fVar56 = patch->patch_v[1][3].field_0.m128[0];
    fVar61 = patch->patch_v[0][0].field_0.m128[1];
    fVar65 = patch->patch_v[1][0].field_0.m128[1];
    fVar71 = patch->patch_v[2][0].field_0.m128[1];
    fVar75 = patch->patch_v[3][0].field_0.m128[1];
    fVar79 = patch->patch_v[0][1].field_0.m128[1];
    fVar84 = patch->patch_v[1][1].field_0.m128[1];
    fVar86 = patch->patch_v[2][1].field_0.m128[1];
    fVar88 = patch->patch_v[3][1].field_0.m128[1];
    fVar90 = patch->patch_v[0][2].field_0.m128[1];
    fVar3 = patch->patch_v[2][2].field_0.m128[1];
    fVar4 = patch->patch_v[3][2].field_0.m128[1];
    fVar5 = patch->patch_v[1][2].field_0.m128[1];
    fVar6 = patch->patch_v[2][3].field_0.m128[1];
    fVar9 = patch->patch_v[3][3].field_0.m128[1];
    fVar7 = patch->patch_v[1][3].field_0.m128[1];
    fVar8 = patch->patch_v[0][3].field_0.m128[1];
    fVar103 = (fVar61 * fVar54 + fVar65 * fVar83 + fVar71 * fVar29 + fVar75 * fVar69) * fVar11 +
              (fVar79 * fVar54 + fVar84 * fVar83 + fVar86 * fVar29 + fVar88 * fVar69) * fVar45 +
              (fVar90 * fVar54 + fVar5 * fVar83 + fVar3 * fVar29 + fVar4 * fVar69) * fVar30 +
              (fVar8 * fVar54 + fVar7 * fVar83 + fVar6 * fVar29 + fVar9 * fVar69) * fVar10;
    fVar106 = (fVar61 * fVar59 + fVar65 * fVar85 + fVar71 * fVar33 + fVar75 * fVar72) * fVar16 +
              (fVar79 * fVar59 + fVar84 * fVar85 + fVar86 * fVar33 + fVar88 * fVar72) * fVar47 +
              (fVar90 * fVar59 + fVar5 * fVar85 + fVar3 * fVar33 + fVar4 * fVar72) * fVar34 +
              (fVar8 * fVar59 + fVar7 * fVar85 + fVar6 * fVar33 + fVar9 * fVar72) * fVar15;
    fVar108 = (fVar61 * fVar63 + fVar65 * fVar87 + fVar71 * fVar37 + fVar75 * fVar76) * fVar21 +
              (fVar79 * fVar63 + fVar84 * fVar87 + fVar86 * fVar37 + fVar88 * fVar76) * fVar49 +
              (fVar90 * fVar63 + fVar5 * fVar87 + fVar3 * fVar37 + fVar4 * fVar76) * fVar38 +
              (fVar8 * fVar63 + fVar7 * fVar87 + fVar6 * fVar37 + fVar9 * fVar76) * fVar20;
    fVar110 = (fVar61 * fVar67 + fVar65 * fVar89 + fVar71 * fVar41 + fVar75 * fVar80) * fVar26 +
              (fVar79 * fVar67 + fVar84 * fVar89 + fVar86 * fVar41 + fVar88 * fVar80) * fVar51 +
              (fVar90 * fVar67 + fVar5 * fVar89 + fVar3 * fVar41 + fVar4 * fVar80) * fVar42 +
              (fVar8 * fVar67 + fVar7 * fVar89 + fVar6 * fVar41 + fVar9 * fVar80) * fVar25;
    fVar61 = patch->patch_v[0][0].field_0.m128[2];
    fVar65 = patch->patch_v[1][0].field_0.m128[2];
    fVar71 = patch->patch_v[2][0].field_0.m128[2];
    fVar75 = patch->patch_v[3][0].field_0.m128[2];
    fVar79 = patch->patch_v[0][1].field_0.m128[2];
    fVar84 = patch->patch_v[2][1].field_0.m128[2];
    fVar86 = patch->patch_v[3][1].field_0.m128[2];
    fVar88 = patch->patch_v[1][1].field_0.m128[2];
    fVar90 = patch->patch_v[2][2].field_0.m128[2];
    fVar3 = patch->patch_v[3][2].field_0.m128[2];
    fVar4 = patch->patch_v[1][2].field_0.m128[2];
    fVar5 = patch->patch_v[0][2].field_0.m128[2];
    fVar9 = patch->patch_v[3][3].field_0.m128[2];
    fVar6 = patch->patch_v[2][3].field_0.m128[2];
    fVar7 = patch->patch_v[1][3].field_0.m128[2];
    fVar8 = patch->patch_v[0][3].field_0.m128[2];
    fVar112 = (fVar61 * fVar54 + fVar65 * fVar83 + fVar71 * fVar29 + fVar75 * fVar69) * fVar11 +
              (fVar79 * fVar54 + fVar88 * fVar83 + fVar84 * fVar29 + fVar86 * fVar69) * fVar45 +
              (fVar5 * fVar54 + fVar4 * fVar83 + fVar90 * fVar29 + fVar3 * fVar69) * fVar30 +
              (fVar8 * fVar54 + fVar7 * fVar83 + fVar6 * fVar29 + fVar9 * fVar69) * fVar10;
    fVar114 = (fVar61 * fVar59 + fVar65 * fVar85 + fVar71 * fVar33 + fVar75 * fVar72) * fVar16 +
              (fVar79 * fVar59 + fVar88 * fVar85 + fVar84 * fVar33 + fVar86 * fVar72) * fVar47 +
              (fVar5 * fVar59 + fVar4 * fVar85 + fVar90 * fVar33 + fVar3 * fVar72) * fVar34 +
              (fVar8 * fVar59 + fVar7 * fVar85 + fVar6 * fVar33 + fVar9 * fVar72) * fVar15;
    fVar116 = (fVar61 * fVar63 + fVar65 * fVar87 + fVar71 * fVar37 + fVar75 * fVar76) * fVar21 +
              (fVar79 * fVar63 + fVar88 * fVar87 + fVar84 * fVar37 + fVar86 * fVar76) * fVar49 +
              (fVar5 * fVar63 + fVar4 * fVar87 + fVar90 * fVar37 + fVar3 * fVar76) * fVar38 +
              (fVar8 * fVar63 + fVar7 * fVar87 + fVar6 * fVar37 + fVar9 * fVar76) * fVar20;
    fVar9 = (fVar61 * fVar67 + fVar65 * fVar89 + fVar71 * fVar41 + fVar75 * fVar80) * fVar26 +
            (fVar79 * fVar67 + fVar88 * fVar89 + fVar84 * fVar41 + fVar86 * fVar80) * fVar51 +
            (fVar5 * fVar67 + fVar4 * fVar89 + fVar90 * fVar41 + fVar3 * fVar80) * fVar42 +
            (fVar8 * fVar67 + fVar7 * fVar89 + fVar6 * fVar41 + fVar9 * fVar80) * fVar25;
    *(float *)&in_RDI->field_0 =
         (fVar99 * fVar54 + fVar100 * fVar83 + fVar101 * fVar29 + fVar102 * fVar69) * fVar11 +
         (fVar91 * fVar54 + fVar93 * fVar83 + fVar95 * fVar29 + fVar97 * fVar69) * fVar45 +
         (fVar14 * fVar54 + fVar19 * fVar83 + fVar24 * fVar29 + fVar53 * fVar69) * fVar30 +
         (fVar58 * fVar54 + fVar56 * fVar83 + fVar62 * fVar29 + fVar66 * fVar69) * fVar10;
    *(float *)((long)&in_RDI->field_0 + 4) =
         (fVar99 * fVar59 + fVar100 * fVar85 + fVar101 * fVar33 + fVar102 * fVar72) * fVar16 +
         (fVar91 * fVar59 + fVar93 * fVar85 + fVar95 * fVar33 + fVar97 * fVar72) * fVar47 +
         (fVar14 * fVar59 + fVar19 * fVar85 + fVar24 * fVar33 + fVar53 * fVar72) * fVar34 +
         (fVar58 * fVar59 + fVar56 * fVar85 + fVar62 * fVar33 + fVar66 * fVar72) * fVar15;
    *(float *)((long)&in_RDI->field_0 + 8) =
         (fVar99 * fVar63 + fVar100 * fVar87 + fVar101 * fVar37 + fVar102 * fVar76) * fVar21 +
         (fVar91 * fVar63 + fVar93 * fVar87 + fVar95 * fVar37 + fVar97 * fVar76) * fVar49 +
         (fVar14 * fVar63 + fVar19 * fVar87 + fVar24 * fVar37 + fVar53 * fVar76) * fVar38 +
         (fVar58 * fVar63 + fVar56 * fVar87 + fVar62 * fVar37 + fVar66 * fVar76) * fVar20;
    *(float *)((long)&in_RDI->field_0 + 0xc) =
         (fVar99 * fVar67 + fVar100 * fVar89 + fVar101 * fVar41 + fVar102 * fVar80) * fVar26 +
         (fVar91 * fVar67 + fVar93 * fVar89 + fVar95 * fVar41 + fVar97 * fVar80) * fVar51 +
         (fVar14 * fVar67 + fVar19 * fVar89 + fVar24 * fVar41 + fVar53 * fVar80) * fVar42 +
         (fVar58 * fVar67 + fVar56 * fVar89 + fVar62 * fVar41 + fVar66 * fVar80) * fVar25;
  }
  *(float *)((long)&in_RDI->field_0 + 0x10) = fVar103;
  *(float *)((long)&in_RDI->field_0 + 0x14) = fVar106;
  *(float *)((long)&in_RDI->field_0 + 0x18) = fVar108;
  *(float *)((long)&in_RDI->field_0 + 0x1c) = fVar110;
  *(float *)((long)&in_RDI->field_0 + 0x20) = fVar112;
  *(float *)((long)&in_RDI->field_0 + 0x24) = fVar114;
  *(float *)((long)&in_RDI->field_0 + 0x28) = fVar116;
  *(float *)((long)&in_RDI->field_0 + 0x2c) = fVar9;
  return in_RDI;
}

Assistant:

Vec3<simdf> patchEval(const SubdivPatch1Base& patch, const simdf& uu, const simdf& vv) 
    {
      if (likely(patch.type == SubdivPatch1Base::BEZIER_PATCH))
        return ((BezierPatch3fa*)patch.patch_v)->eval(uu,vv);
      else if (likely(patch.type == SubdivPatch1Base::BSPLINE_PATCH))
        return ((BSplinePatch3fa*)patch.patch_v)->eval(uu,vv);
      else if (likely(patch.type == SubdivPatch1Base::GREGORY_PATCH))
        return ((DenseGregoryPatch3fa*)patch.patch_v)->eval(uu,vv);
      else if (likely(patch.type == SubdivPatch1Base::BILINEAR_PATCH))
        return ((BilinearPatch3fa*)patch.patch_v)->eval(uu,vv);
      return Vec3<simdf>( zero );
    }